

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

void __thiscall CVmFormatter::buffer_char(CVmFormatter *this,wchar_t c)

{
  CCharmapToLocal *pCVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  wchar_t *pwVar5;
  
  pCVar1 = this->cmap_;
  if (this->cmap_ == (CCharmapToLocal *)0x0) {
    pCVar1 = G_cmap_to_ui_X;
  }
  if (pCVar1->exp_map_[(ulong)((uint)c >> 8) & 0xff] == (uint *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = pCVar1->exp_map_[(ulong)((uint)c >> 8) & 0xff][(ulong)(uint)c & 0xff];
  }
  if (uVar2 == 0) {
    lVar4 = 0;
    pwVar5 = (wchar_t *)0x0;
  }
  else {
    pwVar5 = pCVar1->exp_array_ + uVar2 + 1;
    lVar4 = (long)pCVar1->exp_array_[uVar2];
  }
  if (pwVar5 != (wchar_t *)0x0) {
    if (lVar4 != 0) {
      lVar3 = 0;
      do {
        buffer_expchar(this,pwVar5[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
    }
    return;
  }
  buffer_expchar(this,c);
  return;
}

Assistant:

void CVmFormatter::buffer_char(VMG_ wchar_t c)
{
    const wchar_t *exp;
    size_t exp_len;

    /* check for a display expansion */
    exp = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->get_expansion(c, &exp_len);
    if (exp != 0)
    {
        /* write each character of the expansion */
        for ( ; exp_len != 0 ; ++exp, --exp_len)
            buffer_expchar(vmg_ *exp);
    }
    else
    {
        /* there's no expansion - buffer the character as-is */
        buffer_expchar(vmg_ c);
    }
}